

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

void __thiscall
CTcMake::build_image_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,char *image_fname,
          int *error_count,int *warning_count,CVmRuntimeSymbols *runtime_symtab,
          CVmRuntimeSymbols *runtime_macros,char *tool_data)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  FILE *pFVar4;
  char *fname;
  CVmFile *fp;
  CTcMakeModule *mod;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  char obj_fname [4096];
  CVmFile *local_1138;
  uint local_1118 [2];
  long local_1110;
  void *local_1108;
  __jmp_buf_tag local_1100;
  char local_1038 [4104];
  
  local_1138 = (CVmFile *)0x0;
  G_err_frame::__tls_init();
  local_1110 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_1118;
  local_1118[0] = _setjmp(&local_1100);
  if (local_1118[0] == 0) {
    CTcMain::init((EVP_PKEY_CTX *)hostifc);
    set_compiler_options(this);
    mod = this->mod_head_;
    if (mod != (CTcMakeModule *)0x0) {
      do {
        if (mod->exclude_ == 0) {
          get_objfile(this,local_1038,mod);
          pFVar4 = fopen(local_1038,"rb");
          if (pFVar4 == (FILE *)0x0) {
            CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296c,local_1038);
          }
          else {
            fname = local_1038;
            if (this->test_report_mode_ != 0) {
              fname = os_get_root_name(local_1038);
            }
            fp = (CVmFile *)operator_new(0x10);
            fp->fp_ = (osfildef *)0x0;
            fp->seek_base_ = 0;
            fp->fp_ = (osfildef *)pFVar4;
            fp->seek_base_ = 0;
            CTcGenTarg::load_object_file(G_cg,fp,fname);
            if (fp != (CVmFile *)0x0) {
              CVmFile::~CVmFile(fp);
              operator_delete(fp,0x10);
            }
          }
        }
        mod = mod->nxt_;
      } while (mod != (CTcMakeModule *)0x0);
    }
    if ((G_tcmain->error_count_ == 0) &&
       (iVar3 = CTcParser::check_unresolved_externs(G_prs), iVar3 == 0)) {
      pFVar4 = fopen(image_fname,"wb");
      if (pFVar4 == (FILE *)0x0) {
        CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296a,image_fname);
      }
      else {
        local_1138 = (CVmFile *)operator_new(0x10);
        local_1138->fp_ = (osfildef *)0x0;
        local_1138->seek_base_ = 0;
        local_1138->fp_ = (osfildef *)pFVar4;
        local_1138->seek_base_ = 0;
        CTcGenTarg::write_to_image(G_cg,local_1138,this->data_xor_mask_,tool_data);
      }
    }
  }
  if (-1 < (short)local_1118[0]) {
    local_1118[0] = local_1118[0] | 0x8000;
    *error_count = *error_count + G_tcmain->error_count_;
    *warning_count = *warning_count + G_tcmain->warning_count_;
    if (*error_count == 0) {
      if (runtime_symtab != (CVmRuntimeSymbols *)0x0) {
        CTcPrsSymtab::enum_entries(G_prs->global_symtab_,build_runtime_symtab_cb,runtime_symtab);
      }
      if (runtime_macros != (CVmRuntimeSymbols *)0x0) {
        (*G_tok->defines_->_vptr_CTcMacroTable[5])
                  (G_tok->defines_,build_runtime_macro_cb,runtime_macros);
      }
    }
    if ((local_1138 != (CVmFile *)0x0) && (local_1138 != (CVmFile *)0x0)) {
      CVmFile::~CVmFile(local_1138);
      operator_delete(local_1138,0x10);
    }
    if ((*error_count != 0) || ((this->warnings_as_errors_ != 0 && (*warning_count != 0)))) {
      remove(image_fname);
    }
    CTcMain::terminate();
  }
  lVar1 = local_1110;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_1118[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_1108;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_1118[0] & 2) != 0) {
    free(local_1108);
  }
  return;
}

Assistant:

void CTcMake::build_image_file(CTcHostIfc *hostifc,
                               CResLoader *res_loader,
                               const char *image_fname,
                               int *error_count, int *warning_count,
                               CVmRuntimeSymbols *runtime_symtab,
                               CVmRuntimeSymbols *runtime_macros,
                               const char tool_data[4])
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;
    CVmFile *volatile objfile = 0;

    err_try
    {
        CTcMakeModule *mod;

        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();

        /* load each object module */
        for (mod = mod_head_ ; mod != 0 ; mod = mod->get_next())
        {
            osfildef *objfp;
            char obj_fname[OSFNMAX];

            /* if this module is excluded, skip it */
            if (mod->is_excluded())
                continue;

            /* derive the object filename */
            get_objfile(obj_fname, mod);

            /* open the file */
            objfp = osfoprb(obj_fname, OSFTT3OBJ);
            if (objfp == 0)
            {
                /* log the error */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_OPEN_OBJ, obj_fname);
            }
            else
            {
                const char *report_fname;

                /* 
                 *   if we're in test reporting mode, use the root name only
                 *   in error reports 
                 */
                if (test_report_mode_)
                    report_fname = os_get_root_name((char *)obj_fname);
                else
                    report_fname = obj_fname;
                
                /* set up the file object */
                objfile = new CVmFile();
                objfile->set_file(objfp, 0);

                /* load it */
                G_cg->load_object_file(objfile, report_fname);

                /* done with the file - close it */
                delete objfile;
                objfile = 0;
            }
        }

        /* if we encountered errors loading object files, give up */
        if (G_tcmain->get_error_count() != 0)
            goto done;

        /* check for unresolved externals */
        if (G_prs->check_unresolved_externs())
            goto done;

        /* set up the output file */
        fpout = osfopwb(image_fname, OSFTT3IMG);
        if (fpout == 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                TCERR_MAKE_CANNOT_CREATE_IMG, image_fname);
            goto done;
        }
        fp = new CVmFile();
        fp->set_file(fpout, 0);

        /* write the image file */
        G_cg->write_to_image(fp, data_xor_mask_, tool_data);

    done: ;
    }